

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

wstring * __thiscall
PDA::Transducer::Generator::mov_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,Register *source,Register *dest,
          wchar_t suff)

{
  wchar_t local_94;
  wstring local_78;
  wstring local_58;
  allocator<wchar_t> local_26;
  undefined1 local_25;
  wchar_t local_24;
  Register *pRStack_20;
  wchar_t suff_local;
  Register *dest_local;
  Register *source_local;
  wstring *result;
  
  local_24 = (wchar_t)dest;
  local_25 = 0;
  pRStack_20 = source;
  dest_local = (Register *)this;
  source_local = (Register *)__return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"mov",&local_26);
  std::allocator<wchar_t>::~allocator(&local_26);
  if (local_24 == L'\0') {
    local_94 = registerSuffix(dest_local);
  }
  else {
    local_94 = local_24;
  }
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,local_94);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,L"\t");
  Register::toString_abi_cxx11_(&local_58,dest_local);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,L",\t");
  Register::toString_abi_cxx11_(&local_78,pRStack_20);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(wstring *)&local_78);
  std::__cxx11::wstring::~wstring((wstring *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::mov(const Register &source, const Register &dest, const wchar_t suff)
{
    std::wstring result = L"mov";
    result += suff == L'\0' ? registerSuffix(source) : suff;
    result += L"\t";
    result += source.toString();
    result += L",\t";
    result += dest.toString();
    return result;
}